

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

CK_RV __thiscall Token::initUserPIN(Token *this,ByteString *pin)

{
  ObjectStoreToken *pOVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  CK_RV CVar5;
  MutexLocker lock;
  ByteString userPINBlob;
  ByteString soPINBlob;
  MutexLocker MStack_a8;
  ByteString local_98;
  ByteString local_70;
  ByteString local_48;
  
  MutexLocker::MutexLocker(&MStack_a8,this->tokenMutex);
  CVar5 = 5;
  if (this->sdm != (SecureDataManager *)0x0) {
    bVar2 = SecureDataManager::setUserPIN(this->sdm,pin);
    if (bVar2) {
      pOVar1 = this->token;
      SecureDataManager::getUserPINBlob(&local_48,this->sdm);
      iVar4 = (*pOVar1->_vptr_ObjectStoreToken[2])(pOVar1,&local_48);
      local_48._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_48.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      if ((char)iVar4 != '\0') {
        ByteString::ByteString(&local_70);
        ByteString::ByteString(&local_98);
        iVar4 = (*this->token->_vptr_ObjectStoreToken[1])(this->token,&local_70);
        if ((char)iVar4 == '\0') {
          uVar3 = false;
        }
        else {
          iVar4 = (*this->token->_vptr_ObjectStoreToken[3])(this->token,&local_98);
          uVar3 = (undefined1)iVar4;
        }
        this->valid = (bool)uVar3;
        local_98._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_98.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        local_70._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_70.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        CVar5 = 0;
      }
    }
  }
  MutexLocker::~MutexLocker(&MStack_a8);
  return CVar5;
}

Assistant:

CK_RV Token::initUserPIN(ByteString& pin)
{
	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (sdm == NULL) return CKR_GENERAL_ERROR;

	if (sdm->setUserPIN(pin) == false) return CKR_GENERAL_ERROR;

	// Save PIN to token file
	if (token->setUserPIN(sdm->getUserPINBlob()) == false) return CKR_GENERAL_ERROR;

	ByteString soPINBlob, userPINBlob;
	valid = token->getSOPIN(soPINBlob) && token->getUserPIN(userPINBlob);

	return CKR_OK;
}